

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polyline_shape.cc
# Opt level: O3

Edge * __thiscall
S2LaxPolylineShape::edge(Edge *__return_storage_ptr__,S2LaxPolylineShape *this,int e)

{
  int iVar1;
  Vector3<double> *pVVar2;
  VType VVar3;
  int iVar4;
  S2LogMessage SStack_18;
  
  iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
  iVar4 = 1;
  if (1 < iVar1) {
    iVar4 = iVar1;
  }
  if (e < iVar4 + -1) {
    pVVar2 = (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
    (__return_storage_ptr__->v0).c_[2] = pVVar2[e].c_[2];
    VVar3 = pVVar2[e].c_[1];
    (__return_storage_ptr__->v0).c_[0] = pVVar2[e].c_[0];
    (__return_storage_ptr__->v0).c_[1] = VVar3;
    VVar3 = pVVar2[(long)e + 1].c_[1];
    (__return_storage_ptr__->v1).c_[0] = pVVar2[(long)e + 1].c_[0];
    (__return_storage_ptr__->v1).c_[1] = VVar3;
    (__return_storage_ptr__->v1).c_[2] = pVVar2[(long)e + 1].c_[2];
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polyline_shape.cc"
             ,0x47,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (e) < (num_edges()) ",0x22);
  abort();
}

Assistant:

bool S2LaxPolylineShape::Init(Decoder* decoder) {
  s2coding::EncodedS2PointVector vertices;
  if (!vertices.Init(decoder)) return false;
  num_vertices_ = vertices.size();
  vertices_ = make_unique<S2Point[]>(vertices.size());
  for (int i = 0; i < num_vertices_; ++i) {
    vertices_[i] = vertices[i];
  }
  return true;
}